

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O1

QModelIndex * __thiscall
QUndoModel::selectedIndex(QModelIndex *__return_storage_ptr__,QUndoModel *this)

{
  int iVar1;
  
  if (this->m_stack == (QUndoStack *)0x0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    iVar1 = QUndoStack::index();
    __return_storage_ptr__->r = iVar1;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QUndoModel::selectedIndex() const
{
    return m_stack == nullptr ? QModelIndex() : createIndex(m_stack->index(), 0);
}